

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::HandleUuidCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  ulong uVar5;
  char *value;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [8];
  string e_1;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  undefined1 local_1d8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> uuidNamespace;
  cmUuid uuidGenerator;
  string uuid;
  undefined1 local_168 [8];
  string e;
  string local_140;
  allocator local_119;
  string local_118;
  undefined4 local_f8;
  allocator local_f1;
  string local_f0;
  byte local_c9;
  undefined1 local_c8 [7];
  bool uuidUpperCase;
  string uuidType;
  string uuidName;
  string uuidNamespaceString;
  string *outputVariable;
  allocator local_49;
  string local_48;
  uint local_24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  uint argsIndex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  local_24 = 1;
  pvStack_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"UUID sub-command requires an output variable.",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_0052bd4c;
  }
  uVar5 = (ulong)local_24;
  local_24 = local_24 + 1;
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](pvStack_20,uVar5);
  std::__cxx11::string::string((string *)(uuidName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(uuidType.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_c8);
  local_c9 = 0;
  while (sVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(pvStack_20), local_24 < sVar2) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_20,(ulong)local_24);
    bVar1 = std::operator==(pvVar4,"NAMESPACE");
    if (bVar1) {
      local_24 = local_24 + 1;
      uVar5 = (ulong)local_24;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvStack_20);
      if (sVar2 <= uVar5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_f0,"UUID sub-command, NAMESPACE requires a value.",&local_f1);
        cmCommand::SetError(&this->super_cmCommand,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
        this_local._7_1_ = 0;
        local_f8 = 1;
        goto LAB_0052bd06;
      }
      uVar5 = (ulong)local_24;
      local_24 = local_24 + 1;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_20,uVar5);
      std::__cxx11::string::operator=
                ((string *)(uuidName.field_2._M_local_buf + 8),(string *)pvVar4);
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_20,(ulong)local_24);
      bVar1 = std::operator==(pvVar4,"NAME");
      if (bVar1) {
        local_24 = local_24 + 1;
        uVar5 = (ulong)local_24;
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(pvStack_20);
        if (sVar2 <= uVar5) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_118,"UUID sub-command, NAME requires a value.",&local_119);
          cmCommand::SetError(&this->super_cmCommand,&local_118);
          std::__cxx11::string::~string((string *)&local_118);
          std::allocator<char>::~allocator((allocator<char> *)&local_119);
          this_local._7_1_ = 0;
          local_f8 = 1;
          goto LAB_0052bd06;
        }
        uVar5 = (ulong)local_24;
        local_24 = local_24 + 1;
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvStack_20,uVar5);
        std::__cxx11::string::operator=
                  ((string *)(uuidType.field_2._M_local_buf + 8),(string *)pvVar4);
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvStack_20,(ulong)local_24);
        bVar1 = std::operator==(pvVar4,"TYPE");
        if (bVar1) {
          local_24 = local_24 + 1;
          uVar5 = (ulong)local_24;
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(pvStack_20);
          if (sVar2 <= uVar5) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_140,"UUID sub-command, TYPE requires a value.",
                       (allocator *)(e.field_2._M_local_buf + 0xf));
            cmCommand::SetError(&this->super_cmCommand,&local_140);
            std::__cxx11::string::~string((string *)&local_140);
            std::allocator<char>::~allocator((allocator<char> *)(e.field_2._M_local_buf + 0xf));
            this_local._7_1_ = 0;
            local_f8 = 1;
            goto LAB_0052bd06;
          }
          uVar5 = (ulong)local_24;
          local_24 = local_24 + 1;
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvStack_20,uVar5);
          std::__cxx11::string::operator=((string *)local_c8,(string *)pvVar4);
        }
        else {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvStack_20,(ulong)local_24);
          bVar1 = std::operator==(pvVar4,"UPPER");
          if (!bVar1) {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](pvStack_20,(ulong)local_24);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&uuid.field_2 + 8),"UUID sub-command does not recognize option ",
                           pvVar3);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_168,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&uuid.field_2 + 8),".");
            std::__cxx11::string::~string((string *)(uuid.field_2._M_local_buf + 8));
            cmCommand::SetError(&this->super_cmCommand,(string *)local_168);
            this_local._7_1_ = 0;
            local_f8 = 1;
            std::__cxx11::string::~string((string *)local_168);
            goto LAB_0052bd06;
          }
          local_24 = local_24 + 1;
          local_c9 = 1;
        }
      }
    }
  }
  std::__cxx11::string::string
            ((string *)
             &uuidGenerator.Groups.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmUuid::cmUuid((cmUuid *)
                 &uuidNamespace.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8);
  bVar1 = cmUuid::StringToBinary
                    ((cmUuid *)
                     &uuidNamespace.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (string *)((long)&uuidName.field_2 + 8),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8);
  if (bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c8,"MD5");
    if (bVar1) {
      cmUuid::FromMd5(&local_220,
                      (cmUuid *)
                      &uuidNamespace.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8,
                      (string *)((long)&uuidType.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)
                 &uuidGenerator.Groups.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(string *)&local_220);
      std::__cxx11::string::~string((string *)&local_220);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8,"SHA1");
      if (!bVar1) {
        std::operator+(&local_280,"UUID sub-command, unknown TYPE \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_260,&local_280,"\'.");
        std::__cxx11::string::~string((string *)&local_280);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_260);
        this_local._7_1_ = 0;
        local_f8 = 1;
        std::__cxx11::string::~string((string *)local_260);
        goto LAB_0052bcba;
      }
      cmUuid::FromSha1((string *)((long)&e_1.field_2 + 8),
                       (cmUuid *)
                       &uuidNamespace.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8,
                       (string *)((long)&uuidType.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)
                 &uuidGenerator.Groups.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(string *)(e_1.field_2._M_local_buf + 8)
                );
      std::__cxx11::string::~string((string *)(e_1.field_2._M_local_buf + 8));
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      if ((local_c9 & 1) != 0) {
        cmsys::SystemTools::UpperCase
                  (&local_2c8,
                   (string *)
                   &uuidGenerator.Groups.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator=
                  ((string *)
                   &uuidGenerator.Groups.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
      }
      this_00 = (this->super_cmCommand).Makefile;
      value = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_00,pvVar3,value);
      this_local._7_1_ = 1;
      local_f8 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2a0,"UUID sub-command, generation failed.",&local_2a1);
      cmCommand::SetError(&this->super_cmCommand,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
      this_local._7_1_ = 0;
      local_f8 = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1f8,"UUID sub-command, malformed NAMESPACE UUID.",&local_1f9);
    cmCommand::SetError(&this->super_cmCommand,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    this_local._7_1_ = 0;
    local_f8 = 1;
  }
LAB_0052bcba:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8);
  cmUuid::~cmUuid((cmUuid *)
                  &uuidNamespace.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &uuidGenerator.Groups.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
LAB_0052bd06:
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)(uuidType.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(uuidName.field_2._M_local_buf + 8));
LAB_0052bd4c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmStringCommand
::HandleUuidCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  unsigned int argsIndex = 1;

  if(args.size() < 2)
    {
    this->SetError("UUID sub-command requires an output variable.");
    return false;
    }

  const std::string &outputVariable = args[argsIndex++];

  std::string uuidNamespaceString;
  std::string uuidName;
  std::string uuidType;
  bool uuidUpperCase = false;

  while(args.size() > argsIndex)
    {
    if(args[argsIndex] == "NAMESPACE")
      {
      ++argsIndex;
      if(argsIndex >= args.size())
        {
        this->SetError("UUID sub-command, NAMESPACE requires a value.");
        return false;
        }
      uuidNamespaceString = args[argsIndex++];
      }
    else if(args[argsIndex] == "NAME")
      {
      ++argsIndex;
      if(argsIndex >= args.size())
        {
        this->SetError("UUID sub-command, NAME requires a value.");
        return false;
        }
      uuidName = args[argsIndex++];
      }
    else if(args[argsIndex] == "TYPE")
      {
      ++argsIndex;
      if(argsIndex >= args.size())
        {
        this->SetError("UUID sub-command, TYPE requires a value.");
        return false;
        }
      uuidType = args[argsIndex++];
      }
    else if(args[argsIndex] == "UPPER")
      {
      ++argsIndex;
      uuidUpperCase = true;
      }
    else
      {
      std::string e = "UUID sub-command does not recognize option " +
          args[argsIndex] + ".";
      this->SetError(e);
      return false;
      }
    }

  std::string uuid;
  cmUuid uuidGenerator;

  std::vector<unsigned char> uuidNamespace;
  if(!uuidGenerator.StringToBinary(uuidNamespaceString, uuidNamespace))
    {
    this->SetError("UUID sub-command, malformed NAMESPACE UUID.");
    return false;
    }

  if(uuidType == "MD5")
    {
    uuid = uuidGenerator.FromMd5(uuidNamespace, uuidName);
    }
  else if(uuidType == "SHA1")
    {
    uuid = uuidGenerator.FromSha1(uuidNamespace, uuidName);
    }
  else
    {
    std::string e = "UUID sub-command, unknown TYPE '" + uuidType + "'.";
    this->SetError(e);
    return false;
    }

  if(uuid.empty())
    {
    this->SetError("UUID sub-command, generation failed.");
    return false;
    }

  if(uuidUpperCase)
    {
    uuid = cmSystemTools::UpperCase(uuid);
    }

  this->Makefile->AddDefinition(outputVariable, uuid.c_str());
  return true;
#else
  std::ostringstream e;
  e << args[0] << " not available during bootstrap";
  this->SetError(e.str().c_str());
  return false;
#endif
}